

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<std::array<tinyusdz::value::half,4ul>>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,
          array<tinyusdz::value::half,_4UL> *v)

{
  bool bVar1;
  value_type *pvVar2;
  optional<std::array<tinyusdz::value::half,_4UL>_> local_64;
  undefined1 local_5a [8];
  optional<std::array<tinyusdz::value::half,_4UL>_> pv_1;
  undefined1 local_42 [8];
  optional<std::array<tinyusdz::value::half,_4UL>_> pv;
  array<tinyusdz::value::half,_4UL> *v_local;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  PrimVar *this_local;
  
  if (v == (array<tinyusdz::value::half,_4UL> *)0x0) {
    this_local._7_1_ = 0;
    goto LAB_002efe08;
  }
  tinyusdz::value::TimeCode::TimeCode((TimeCode *)&pv.contained,t);
  bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)&pv.contained);
  if (bVar1) {
    get_default_value<std::array<tinyusdz::value::half,4ul>>
              ((optional<std::array<tinyusdz::value::half,_4UL>_> *)((long)&pv_1.contained + 4),this
              );
    nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_4UL>_>::
    optional<std::array<tinyusdz::value::half,_4UL>,_0>
              ((optional<std::array<tinyusdz::value::half,_4UL>_> *)local_42,
               (optional<std::array<tinyusdz::value::half,_4UL>_> *)((long)&pv_1.contained + 4));
    nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_4UL>_>::~optional
              ((optional<std::array<tinyusdz::value::half,_4UL>_> *)((long)&pv_1.contained + 4));
    pv_1.contained._0_1_ =
         nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_42);
    if ((bool)pv_1.contained._0_1_) {
      pvVar2 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_4UL>_>::value
                         ((optional<std::array<tinyusdz::value::half,_4UL>_> *)local_42);
      *(undefined8 *)v->_M_elems = *(undefined8 *)pvVar2->_M_elems;
      this_local._7_1_ = 1;
    }
    pv_1.contained._1_3_ = 0;
    nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_4UL>_>::~optional
              ((optional<std::array<tinyusdz::value::half,_4UL>_> *)local_42);
    if (pv_1.contained._0_4_ != 0) goto LAB_002efe08;
    bVar1 = tinyusdz::value::TimeSamples::empty(&this->_ts);
    if (bVar1) {
      this_local._7_1_ = 0;
      goto LAB_002efe08;
    }
  }
  bVar1 = has_timesamples(this);
  if (bVar1) {
    this_local._7_1_ =
         tinyusdz::value::TimeSamples::get<std::array<tinyusdz::value::half,_4UL>,_nullptr>
                   (&this->_ts,v,t,tinterp);
  }
  else {
    bVar1 = has_default(this);
    if (bVar1) {
      get_default_value<std::array<tinyusdz::value::half,4ul>>(&local_64,this);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_4UL>_>::
      optional<std::array<tinyusdz::value::half,_4UL>,_0>
                ((optional<std::array<tinyusdz::value::half,_4UL>_> *)local_5a,&local_64);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_4UL>_>::~optional(&local_64)
      ;
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_5a);
      if (bVar1) {
        pvVar2 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_4UL>_>::value
                           ((optional<std::array<tinyusdz::value::half,_4UL>_> *)local_5a);
        *(undefined8 *)v->_M_elems = *(undefined8 *)pvVar2->_M_elems;
        this_local._7_1_ = 1;
      }
      pv_1.contained._1_3_ = 0;
      pv_1.contained._0_1_ = bVar1;
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_4UL>_>::~optional
                ((optional<std::array<tinyusdz::value::half,_4UL>_> *)local_5a);
      if (pv_1.contained._0_4_ != 0) goto LAB_002efe08;
    }
    this_local._7_1_ = 0;
  }
LAB_002efe08:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }